

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void estimate_ref_frame_costs
               (AV1_COMMON *cm,MACROBLOCKD *xd,ModeCosts *mode_costs,int segment_id,
               uint *ref_costs_single,uint (*ref_costs_comp) [8])

{
  int aiVar1 [2];
  int aiVar2 [2];
  uint uVar3;
  int i;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int (*paiVar11) [3];
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  undefined8 local_58;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  undefined8 local_44;
  int local_3c;
  
  if (((cm->seg).enabled == '\0') ||
     (((cm->seg).feature_mask[(ulong)(uint)segment_id & 0xff] & 0x20) == 0)) {
    iVar4 = av1_get_intra_inter_context(xd);
    *ref_costs_single = mode_costs->intra_inter_cost[iVar4][0];
    uVar3 = mode_costs->intra_inter_cost[iVar4][1];
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      ref_costs_single[lVar10] = uVar3;
    }
    iVar4 = av1_get_pred_context_single_ref_p1(xd);
    iVar5 = av1_get_pred_context_single_ref_p2(xd);
    iVar6 = av1_get_pred_context_single_ref_p3(xd);
    iVar7 = av1_get_pred_context_single_ref_p4(xd);
    iVar8 = av1_get_pred_context_single_ref_p5(xd);
    iVar9 = av1_get_pred_context_single_ref_p6(xd);
    uVar14 = ref_costs_single[1] + mode_costs->single_ref_cost[iVar4][0][0];
    ref_costs_single[1] = uVar14;
    uVar13 = ref_costs_single[2] + mode_costs->single_ref_cost[iVar4][0][0];
    ref_costs_single[2] = uVar13;
    uVar15 = ref_costs_single[3] + mode_costs->single_ref_cost[iVar4][0][0];
    ref_costs_single[3] = uVar15;
    uVar18 = ref_costs_single[4] + mode_costs->single_ref_cost[iVar4][0][0];
    ref_costs_single[4] = uVar18;
    uVar17 = ref_costs_single[5] + mode_costs->single_ref_cost[iVar4][0][1];
    ref_costs_single[5] = uVar17;
    uVar19 = ref_costs_single[6] + mode_costs->single_ref_cost[iVar4][0][1];
    ref_costs_single[6] = uVar19;
    uVar20 = ref_costs_single[7] + mode_costs->single_ref_cost[iVar4][0][1];
    ref_costs_single[7] = uVar20;
    uVar14 = uVar14 + mode_costs->single_ref_cost[iVar6][2][0];
    ref_costs_single[1] = uVar14;
    uVar13 = uVar13 + mode_costs->single_ref_cost[iVar6][2][0];
    ref_costs_single[2] = uVar13;
    uVar15 = uVar15 + mode_costs->single_ref_cost[iVar6][2][1];
    ref_costs_single[3] = uVar15;
    uVar18 = uVar18 + mode_costs->single_ref_cost[iVar6][2][1];
    ref_costs_single[4] = uVar18;
    uVar17 = uVar17 + mode_costs->single_ref_cost[iVar5][1][0];
    ref_costs_single[5] = uVar17;
    uVar19 = uVar19 + mode_costs->single_ref_cost[iVar5][1][0];
    ref_costs_single[6] = uVar19;
    ref_costs_single[7] = uVar20 + mode_costs->single_ref_cost[iVar5][1][1];
    ref_costs_single[1] = uVar14 + mode_costs->single_ref_cost[iVar7][3][0];
    ref_costs_single[2] = uVar13 + mode_costs->single_ref_cost[iVar7][3][1];
    ref_costs_single[3] = uVar15 + mode_costs->single_ref_cost[iVar8][4][0];
    ref_costs_single[4] = uVar18 + mode_costs->single_ref_cost[iVar8][4][1];
    ref_costs_single[5] = uVar17 + mode_costs->single_ref_cost[iVar9][5][0];
    ref_costs_single[6] = uVar19 + mode_costs->single_ref_cost[iVar9][5][1];
    if ((cm->current_frame).reference_mode == '\0') {
      puVar12 = ref_costs_comp[1] + 5;
      for (lVar10 = 1; lVar10 != 5; lVar10 = lVar10 + 1) {
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          puVar12[lVar16] = 0x200;
        }
        puVar12 = puVar12 + 8;
      }
      *(uint *)((long)(ref_costs_comp + 1) + 8) = 0x200;
      *(uint *)((long)(ref_costs_comp + 1) + 0xc) = 0x200;
      ref_costs_comp[1][4] = 0x200;
      ref_costs_comp[5][7] = 0x200;
    }
    else {
      iVar5 = av1_get_pred_context_comp_bwdref_p(xd);
      iVar6 = av1_get_pred_context_comp_bwdref_p1(xd);
      iVar4 = av1_get_pred_context_comp_ref_p(xd);
      iVar7 = av1_get_pred_context_comp_ref_p1(xd);
      iVar8 = av1_get_pred_context_comp_ref_p2(xd);
      iVar9 = av1_get_comp_reference_type_context(xd);
      paiVar11 = mode_costs->comp_ref_type_cost + iVar9;
      iVar9 = mode_costs->comp_ref_type_cost[iVar9][1] + uVar3;
      aiVar1 = mode_costs->comp_ref_cost[iVar4][0];
      iVar4 = aiVar1[0];
      iVar21 = aiVar1[1];
      aiVar1 = mode_costs->comp_ref_cost[iVar8][2];
      aiVar2 = mode_costs->comp_ref_cost[iVar7][1];
      local_58 = (ulong)(uint)(aiVar2[0] + iVar4 + iVar9) << 0x20;
      _iStack_50 = CONCAT44(aiVar1[0] + iVar21 + iVar9,aiVar2[1] + iVar4 + iVar9);
      iStack_48 = aiVar1[1] + iVar21 + iVar9;
      iVar4 = mode_costs->comp_bwdref_cost[iVar5][0][0];
      local_3c = mode_costs->comp_bwdref_cost[iVar5][0][1];
      aiVar1 = mode_costs->comp_bwdref_cost[iVar6][1];
      local_44 = CONCAT44(iVar4 + aiVar1[1],iVar4 + aiVar1[0]);
      puVar12 = ref_costs_comp[1] + 5;
      for (lVar10 = 1; lVar10 != 5; lVar10 = lVar10 + 1) {
        iVar4 = *(int *)((long)&local_58 + lVar10 * 4);
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          puVar12[lVar16] = *(int *)((long)&local_44 + lVar16 * 4) + iVar4;
        }
        puVar12 = puVar12 + 8;
      }
      iVar4 = av1_get_pred_context_uni_comp_ref_p(xd);
      iVar5 = av1_get_pred_context_uni_comp_ref_p1(xd);
      iVar6 = av1_get_pred_context_uni_comp_ref_p2(xd);
      ref_costs_comp[1][2] =
           (*paiVar11)[0] + uVar3 + mode_costs->uni_comp_ref_cost[iVar4][0][0] +
           mode_costs->uni_comp_ref_cost[iVar5][1][0];
      ref_costs_comp[1][3] =
           (*paiVar11)[0] + uVar3 + mode_costs->uni_comp_ref_cost[iVar4][0][0] +
           mode_costs->uni_comp_ref_cost[iVar5][1][1] + mode_costs->uni_comp_ref_cost[iVar6][2][0];
      ref_costs_comp[1][4] =
           (*paiVar11)[0] + uVar3 + mode_costs->uni_comp_ref_cost[iVar4][0][0] +
           mode_costs->uni_comp_ref_cost[iVar5][1][1] + mode_costs->uni_comp_ref_cost[iVar6][2][1];
      ref_costs_comp[5][7] = uVar3 + (*paiVar11)[0] + mode_costs->uni_comp_ref_cost[iVar4][0][1];
    }
  }
  else {
    *(undefined1 (*) [16])(ref_costs_single + 4) = (undefined1  [16])0x0;
    ref_costs_single[0] = 0;
    ref_costs_single[1] = 0;
    ref_costs_single[2] = 0;
    ref_costs_single[3] = 0;
    for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 0x20) {
      *(undefined1 (*) [16])((long)*ref_costs_comp + lVar10 + 0x10) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)*ref_costs_comp + lVar10) = (undefined1  [16])0x0;
    }
  }
  return;
}

Assistant:

static inline void estimate_ref_frame_costs(
    const AV1_COMMON *cm, const MACROBLOCKD *xd, const ModeCosts *mode_costs,
    int segment_id, unsigned int *ref_costs_single,
    unsigned int (*ref_costs_comp)[REF_FRAMES]) {
  int seg_ref_active =
      segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME);
  if (seg_ref_active) {
    memset(ref_costs_single, 0, REF_FRAMES * sizeof(*ref_costs_single));
    int ref_frame;
    for (ref_frame = 0; ref_frame < REF_FRAMES; ++ref_frame)
      memset(ref_costs_comp[ref_frame], 0,
             REF_FRAMES * sizeof((*ref_costs_comp)[0]));
  } else {
    int intra_inter_ctx = av1_get_intra_inter_context(xd);
    ref_costs_single[INTRA_FRAME] =
        mode_costs->intra_inter_cost[intra_inter_ctx][0];
    unsigned int base_cost = mode_costs->intra_inter_cost[intra_inter_ctx][1];

    for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i)
      ref_costs_single[i] = base_cost;

    const int ctx_p1 = av1_get_pred_context_single_ref_p1(xd);
    const int ctx_p2 = av1_get_pred_context_single_ref_p2(xd);
    const int ctx_p3 = av1_get_pred_context_single_ref_p3(xd);
    const int ctx_p4 = av1_get_pred_context_single_ref_p4(xd);
    const int ctx_p5 = av1_get_pred_context_single_ref_p5(xd);
    const int ctx_p6 = av1_get_pred_context_single_ref_p6(xd);

    // Determine cost of a single ref frame, where frame types are represented
    // by a tree:
    // Level 0: add cost whether this ref is a forward or backward ref
    ref_costs_single[LAST_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[LAST2_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[LAST3_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[GOLDEN_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[BWDREF_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][1];
    ref_costs_single[ALTREF2_FRAME] +=
        mode_costs->single_ref_cost[ctx_p1][0][1];
    ref_costs_single[ALTREF_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][1];

    // Level 1: if this ref is forward ref,
    // add cost whether it is last/last2 or last3/golden
    ref_costs_single[LAST_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][0];
    ref_costs_single[LAST2_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][0];
    ref_costs_single[LAST3_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][1];
    ref_costs_single[GOLDEN_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][1];

    // Level 1: if this ref is backward ref
    // then add cost whether this ref is altref or backward ref
    ref_costs_single[BWDREF_FRAME] += mode_costs->single_ref_cost[ctx_p2][1][0];
    ref_costs_single[ALTREF2_FRAME] +=
        mode_costs->single_ref_cost[ctx_p2][1][0];
    ref_costs_single[ALTREF_FRAME] += mode_costs->single_ref_cost[ctx_p2][1][1];

    // Level 2: further add cost whether this ref is last or last2
    ref_costs_single[LAST_FRAME] += mode_costs->single_ref_cost[ctx_p4][3][0];
    ref_costs_single[LAST2_FRAME] += mode_costs->single_ref_cost[ctx_p4][3][1];

    // Level 2: last3 or golden
    ref_costs_single[LAST3_FRAME] += mode_costs->single_ref_cost[ctx_p5][4][0];
    ref_costs_single[GOLDEN_FRAME] += mode_costs->single_ref_cost[ctx_p5][4][1];

    // Level 2: bwdref or altref2
    ref_costs_single[BWDREF_FRAME] += mode_costs->single_ref_cost[ctx_p6][5][0];
    ref_costs_single[ALTREF2_FRAME] +=
        mode_costs->single_ref_cost[ctx_p6][5][1];

    if (cm->current_frame.reference_mode != SINGLE_REFERENCE) {
      // Similar to single ref, determine cost of compound ref frames.
      // cost_compound_refs = cost_first_ref + cost_second_ref
      const int bwdref_comp_ctx_p = av1_get_pred_context_comp_bwdref_p(xd);
      const int bwdref_comp_ctx_p1 = av1_get_pred_context_comp_bwdref_p1(xd);
      const int ref_comp_ctx_p = av1_get_pred_context_comp_ref_p(xd);
      const int ref_comp_ctx_p1 = av1_get_pred_context_comp_ref_p1(xd);
      const int ref_comp_ctx_p2 = av1_get_pred_context_comp_ref_p2(xd);

      const int comp_ref_type_ctx = av1_get_comp_reference_type_context(xd);
      unsigned int ref_bicomp_costs[REF_FRAMES] = { 0 };

      ref_bicomp_costs[LAST_FRAME] = ref_bicomp_costs[LAST2_FRAME] =
          ref_bicomp_costs[LAST3_FRAME] = ref_bicomp_costs[GOLDEN_FRAME] =
              base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][1];
      ref_bicomp_costs[BWDREF_FRAME] = ref_bicomp_costs[ALTREF2_FRAME] = 0;
      ref_bicomp_costs[ALTREF_FRAME] = 0;

      // cost of first ref frame
      ref_bicomp_costs[LAST_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][0];
      ref_bicomp_costs[LAST2_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][0];
      ref_bicomp_costs[LAST3_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][1];
      ref_bicomp_costs[GOLDEN_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][1];

      ref_bicomp_costs[LAST_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p1][1][0];
      ref_bicomp_costs[LAST2_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p1][1][1];

      ref_bicomp_costs[LAST3_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p2][2][0];
      ref_bicomp_costs[GOLDEN_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p2][2][1];

      // cost of second ref frame
      ref_bicomp_costs[BWDREF_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p][0][0];
      ref_bicomp_costs[ALTREF2_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p][0][0];
      ref_bicomp_costs[ALTREF_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p][0][1];

      ref_bicomp_costs[BWDREF_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p1][1][0];
      ref_bicomp_costs[ALTREF2_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p1][1][1];

      // cost: if one ref frame is forward ref, the other ref is backward ref
      int ref0, ref1;
      for (ref0 = LAST_FRAME; ref0 <= GOLDEN_FRAME; ++ref0) {
        for (ref1 = BWDREF_FRAME; ref1 <= ALTREF_FRAME; ++ref1) {
          ref_costs_comp[ref0][ref1] =
              ref_bicomp_costs[ref0] + ref_bicomp_costs[ref1];
        }
      }

      // cost: if both ref frames are the same side.
      const int uni_comp_ref_ctx_p = av1_get_pred_context_uni_comp_ref_p(xd);
      const int uni_comp_ref_ctx_p1 = av1_get_pred_context_uni_comp_ref_p1(xd);
      const int uni_comp_ref_ctx_p2 = av1_get_pred_context_uni_comp_ref_p2(xd);
      ref_costs_comp[LAST_FRAME][LAST2_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p1][1][0];
      ref_costs_comp[LAST_FRAME][LAST3_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p1][1][1] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p2][2][0];
      ref_costs_comp[LAST_FRAME][GOLDEN_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p1][1][1] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p2][2][1];
      ref_costs_comp[BWDREF_FRAME][ALTREF_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][1];
    } else {
      int ref0, ref1;
      for (ref0 = LAST_FRAME; ref0 <= GOLDEN_FRAME; ++ref0) {
        for (ref1 = BWDREF_FRAME; ref1 <= ALTREF_FRAME; ++ref1)
          ref_costs_comp[ref0][ref1] = 512;
      }
      ref_costs_comp[LAST_FRAME][LAST2_FRAME] = 512;
      ref_costs_comp[LAST_FRAME][LAST3_FRAME] = 512;
      ref_costs_comp[LAST_FRAME][GOLDEN_FRAME] = 512;
      ref_costs_comp[BWDREF_FRAME][ALTREF_FRAME] = 512;
    }
  }
}